

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O2

VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
 Lib::
 VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
 ::getEmpty(void)

{
  int *piVar1;
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  VVar2;
  int iVar3;
  IteratorCore<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  *in_RDI;
  
  if (VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>
      ::getEmpty()::inst == '\0') {
    iVar3 = __cxa_guard_acquire(&VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>
                                 ::getEmpty()::inst);
    if (iVar3 != 0) {
      getEmpty::inst._core =
           (IteratorCore<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
            *)EmptyIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>
              ::operator_new(0x10);
      (getEmpty::inst._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_009fb688;
      (getEmpty::inst._core)->_refCnt = 1;
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>
                           ::getEmpty()::inst);
    }
  }
  VVar2._core = getEmpty::inst._core;
  in_RDI->_vptr_IteratorCore = (_func_int **)getEmpty::inst._core;
  if (VVar2._core !=
      (IteratorCore<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       *)0x0) {
    piVar1 = &(VVar2._core)->_refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
          )in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }